

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O3

int Res_SatSimulate(Res_Sim_t *p,int nPatsLimit,int fOnSet)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  sat_solver *s;
  uint *__ptr;
  lit *begin;
  long lVar8;
  long lVar9;
  bool bVar10;
  timespec ts;
  int local_7c;
  timespec local_48;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (p->pAig->vPos->nSize < 2) {
LAB_00488510:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar4 = (&p->nPats0)[fOnSet != 0];
  if (nPatsLimit <= iVar4) {
    __assert_fail("iPat < nPatsLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                  ,0xeb,"int Res_SatSimulate(Res_Sim_t *, int, int)");
  }
  pVVar2 = (&p->vPats0)[fOnSet != 0];
  s = (sat_solver *)Res_SatSimulateConstr(p->pAig,fOnSet);
  s->fSkipSimplify = 1;
  iVar5 = sat_solver_simplify(s);
  if (iVar5 == 0) {
    uVar6 = -(uint)(iVar4 != 0);
  }
  else {
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 0x20;
    __ptr[1] = 0;
    begin = (lit *)malloc(0x80);
    *(lit **)(__ptr + 2) = begin;
    while (local_7c = iVar4, iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0),
          iVar4 == 1) {
      __ptr[1] = 0;
      if (p->nTruePis < 1) {
        lVar9 = 0;
      }
      else {
        local_38 = (long)(local_7c >> 5);
        lVar9 = 0;
        do {
          pVVar3 = p->pAig->vPis;
          if (pVVar3->nSize <= lVar9) goto LAB_00488510;
          uVar6 = (uint)*(undefined8 *)((long)pVVar3->pArray[lVar9] + 0x40);
          if (((int)uVar6 < 0) || (s->size <= (int)uVar6)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
          }
          bVar10 = s->model[uVar6 & 0x7fffffff] == 1;
          if (bVar10) {
            if (pVVar2->nSize <= lVar9) goto LAB_00488510;
            puVar1 = (uint *)((long)pVVar2->pArray[lVar9] + local_38 * 4);
            *puVar1 = *puVar1 | 1 << ((byte)local_7c & 0x1f);
            iVar4 = (uint)bVar10 + uVar6 * 2;
          }
          else {
            iVar4 = uVar6 * 2;
          }
          uVar6 = __ptr[1];
          if (uVar6 == *__ptr) {
            if ((int)uVar6 < 0x10) {
              if (begin == (lit *)0x0) {
                begin = (lit *)malloc(0x40);
              }
              else {
                begin = (lit *)realloc(begin,0x40);
              }
              *(lit **)(__ptr + 2) = begin;
              uVar7 = 0x10;
              if (begin == (lit *)0x0) {
LAB_0048852f:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
            }
            else {
              if (begin == (lit *)0x0) {
                begin = (lit *)malloc((ulong)uVar6 * 8);
              }
              else {
                begin = (lit *)realloc(begin,(ulong)uVar6 * 8);
              }
              *(lit **)(__ptr + 2) = begin;
              if (begin == (lit *)0x0) goto LAB_0048852f;
              uVar7 = uVar6 * 2;
            }
            *__ptr = uVar7;
          }
          __ptr[1] = uVar6 + 1;
          begin[(int)uVar6] = iVar4;
          lVar9 = lVar9 + 1;
        } while (lVar9 < p->nTruePis);
        lVar9 = (long)(int)__ptr[1];
      }
      iVar5 = sat_solver_addclause(s,begin,begin + lVar9);
      iVar4 = local_7c + 1;
      uVar6 = 1;
      local_7c = iVar4;
      if ((iVar5 == 0) || (local_7c = nPatsLimit, iVar4 == nPatsLimit)) goto LAB_0048844f;
    }
    if (iVar4 == -1) {
      uVar6 = 1;
      if (local_7c == 0) {
        if (fOnSet == 0) {
          p->fConst1 = 1;
        }
        else {
          p->fConst0 = 1;
        }
        local_7c = 0;
        uVar6 = 0;
      }
    }
    else {
      uVar6 = (uint)(local_7c != 0);
    }
LAB_0048844f:
    if (begin != (lit *)0x0) {
      free(begin);
    }
    free(__ptr);
    if (fOnSet == 0) {
      p->nPats0 = local_7c;
    }
    else {
      p->nPats1 = local_7c;
    }
  }
  sat_solver_delete(s);
  iVar4 = clock_gettime(3,&local_48);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeSat = p->timeSat + lVar9 + lVar8;
  return uVar6;
}

Assistant:

int Res_SatSimulate( Res_Sim_t * p, int nPatsLimit, int fOnSet )
{
    Vec_Int_t * vLits;
    Vec_Ptr_t * vPats;
    sat_solver * pSat;
    int RetValue = -1; // Suppress "might be used uninitialized"
    int i, k, value, status, Lit, Var, iPat;
    abctime clk = Abc_Clock();

//printf( "Looking for %s:  ", fOnSet? "onset " : "offset" );

    // decide what problem should be solved
    Lit = toLitCond( (int)(ABC_PTRUINT_T)Abc_NtkPo(p->pAig,1)->pCopy, !fOnSet );
    if ( fOnSet )
    {
        iPat = p->nPats1;
        vPats = p->vPats1;
    }
    else
    {
        iPat = p->nPats0;
        vPats = p->vPats0;
    }
    assert( iPat < nPatsLimit );

    // derive the SAT solver
    pSat = (sat_solver *)Res_SatSimulateConstr( p->pAig, fOnSet );
    pSat->fSkipSimplify = 1;
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        if ( iPat == 0 )
        {
//            if ( fOnSet )
//                p->fConst0 = 1;
//            else
//                p->fConst1 = 1;
            RetValue = 0;
        }
        goto finish;
    }
 
    // enumerate through the SAT assignments
    RetValue = 1;
    vLits = Vec_IntAlloc( 32 );
    for ( k = iPat; k < nPatsLimit; k++ )
    {
        // solve with the assumption
//        status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_False )
        {
//printf( "Const %d\n", !fOnSet );
            if ( k == 0 )
            {
                if ( fOnSet )
                    p->fConst0 = 1;
                else
                    p->fConst1 = 1;
                RetValue = 0;
            }
            break;
        }
        else if ( status == l_True )
        {
            // save the pattern
            Vec_IntClear( vLits );
            for ( i = 0; i < p->nTruePis; i++ )
            {
                Var = (int)(ABC_PTRUINT_T)Abc_NtkPi(p->pAig,i)->pCopy;
//                value = (int)(pSat->model.ptr[Var] == l_True);
                value = sat_solver_var_value(pSat, Var);
                if ( value )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vPats, i), k );
                Lit = toLitCond( Var, value );
                Vec_IntPush( vLits, Lit );
//                printf( "%d", value );
            }
//            printf( "\n" );

            status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            if ( status == 0 )
            {
                k++;
                RetValue = 1; 
                break;
            }
        }
        else
        {
//printf( "Undecided\n" );
            if ( k == 0 )
                RetValue = 0;
            else
                RetValue = 1; 
            break;
        }
    }
    Vec_IntFree( vLits );
//printf( "Found %d patterns\n", k - iPat );

    // set the new number of patterns
    if ( fOnSet )
        p->nPats1 = k;
    else
        p->nPats0 = k;

finish:

    sat_solver_delete( pSat );
p->timeSat += Abc_Clock() - clk;
    return RetValue;
}